

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void jit_rec_SET_N(Trace *trace,BcIns bc)

{
  byte bVar1;
  uint16_t uVar2;
  IrRef IVar3;
  IrRef load;
  BcIns bc_local;
  Trace *trace_local;
  
  uVar2 = bc_arg16(bc);
  IVar3 = ir_load_const(trace,(uint)uVar2);
  bVar1 = bc_arg1(bc);
  trace->last_modified[bVar1] = IVar3;
  return;
}

Assistant:

void jit_rec_SET_N(Trace *trace, BcIns bc) {
	// Load the constant
	IrRef load = ir_load_const(trace, bc_arg16(bc));
	trace->last_modified[bc_arg1(bc)] = load;
}